

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

size_t __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer,op_queue<asio::detail::scheduler_operation> *ops,
              size_t max_cancelled)

{
  wait_op *pwVar1;
  wait_op *pwVar2;
  wait_op *pwVar3;
  scheduler_operation *psVar4;
  wait_op *tmp;
  scheduler_operation *psVar5;
  size_t sVar6;
  bool bVar7;
  
  if ((timer->prev_ == (per_timer_data *)0x0) && (this->timers_ != timer)) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    do {
      bVar7 = sVar6 != max_cancelled;
      pwVar1 = (timer->op_queue_).front_;
      if (pwVar1 != (wait_op *)0x0 && bVar7) {
        std::error_code::operator=(&pwVar1->ec_,operation_aborted);
        pwVar2 = (timer->op_queue_).front_;
        if (pwVar2 != (wait_op *)0x0) {
          pwVar3 = (wait_op *)(pwVar2->super_operation).next_;
          (timer->op_queue_).front_ = pwVar3;
          if (pwVar3 == (wait_op *)0x0) {
            (timer->op_queue_).back_ = (wait_op *)0x0;
          }
          (pwVar2->super_operation).next_ = (scheduler_operation *)0x0;
        }
        (pwVar1->super_operation).next_ = (scheduler_operation *)0x0;
        psVar4 = ops->back_;
        psVar5 = psVar4;
        if (psVar4 == (scheduler_operation *)0x0) {
          psVar5 = (scheduler_operation *)&ops->back_;
        }
        psVar5->next_ = &pwVar1->super_operation;
        (&ops->front_)[psVar4 != (scheduler_operation *)0x0] = &pwVar1->super_operation;
        sVar6 = sVar6 + 1;
      }
    } while (pwVar1 != (wait_op *)0x0 && bVar7);
    if ((timer->op_queue_).front_ == (wait_op *)0x0) {
      remove_timer(this,timer);
    }
  }
  return sVar6;
}

Assistant:

std::size_t cancel_timer(per_timer_data& timer, op_queue<operation>& ops,
      std::size_t max_cancelled = (std::numeric_limits<std::size_t>::max)())
  {
    std::size_t num_cancelled = 0;
    if (timer.prev_ != 0 || &timer == timers_)
    {
      while (wait_op* op = (num_cancelled != max_cancelled)
          ? timer.op_queue_.front() : 0)
      {
        op->ec_ = asio::error::operation_aborted;
        timer.op_queue_.pop();
        ops.push(op);
        ++num_cancelled;
      }
      if (timer.op_queue_.empty())
        remove_timer(timer);
    }
    return num_cancelled;
  }